

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_loongson_integer(DisasContext_conflict6 *ctx,uint32_t opc,int rd,int rs,int rt)

{
  TCGContext_conflict6 *tcg_ctx_00;
  TCGLabel *pTVar1;
  TCGLabel *pTVar2;
  TCGLabel *pTVar3;
  TCGLabel *l2_7;
  TCGLabel *l1_7;
  TCGLabel *l3_3;
  TCGLabel *l2_6;
  TCGLabel *l1_6;
  TCGLabel *l2_5;
  TCGLabel *l1_5;
  TCGLabel *l3_2;
  TCGLabel *l2_4;
  TCGLabel *l1_4;
  TCGLabel *l2_3;
  TCGLabel *l1_3;
  TCGLabel *l3_1;
  TCGLabel *l2_2;
  TCGLabel *l1_2;
  TCGLabel *l2_1;
  TCGLabel *l1_1;
  TCGLabel *l3;
  TCGLabel *l2;
  TCGLabel *l1;
  TCGv_i64 t1;
  TCGv_i64 t0;
  TCGContext_conflict6 *tcg_ctx;
  int rt_local;
  int rs_local;
  int rd_local;
  uint32_t opc_local;
  DisasContext_conflict6 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  if (rd == 0) {
    return;
  }
  if (((opc + 0x8ffffff0 < 4) || (opc + 0x83ffffe8 < 2)) || (opc == 0x7c00001c || opc == 0x7c00001d)
     ) {
    t1 = tcg_temp_new_i64(tcg_ctx_00);
    l1 = (TCGLabel *)tcg_temp_new_i64(tcg_ctx_00);
  }
  else {
    t1 = tcg_temp_local_new_i64(tcg_ctx_00);
    l1 = (TCGLabel *)tcg_temp_local_new_i64(tcg_ctx_00);
  }
  gen_load_gpr(tcg_ctx_00,t1,rs);
  gen_load_gpr(tcg_ctx_00,(TCGv_i64)l1,rt);
  if (opc == 0x70000010) {
LAB_00d3a4aa:
    tcg_gen_mul_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[rd],t1,(TCGv_i64)l1);
    tcg_gen_ext32s_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[rd],tcg_ctx_00->cpu_gpr[rd]);
    goto LAB_00d3adda;
  }
  if (opc == 0x70000011) {
LAB_00d3a9e0:
    tcg_gen_mul_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[rd],t1,(TCGv_i64)l1);
    goto LAB_00d3adda;
  }
  if (opc == 0x70000012) {
LAB_00d3a4f9:
    tcg_gen_ext32u_i64_mips64el(tcg_ctx_00,t1,t1);
    tcg_gen_ext32u_i64_mips64el(tcg_ctx_00,(TCGv_i64)l1,(TCGv_i64)l1);
    tcg_gen_mul_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[rd],t1,(TCGv_i64)l1);
    tcg_gen_ext32s_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[rd],tcg_ctx_00->cpu_gpr[rd]);
    goto LAB_00d3adda;
  }
  if (opc == 0x70000013) {
LAB_00d3aa06:
    tcg_gen_mul_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[rd],t1,(TCGv_i64)l1);
    goto LAB_00d3adda;
  }
  if (opc == 0x70000014) {
LAB_00d3a56a:
    pTVar2 = gen_new_label_mips64el(tcg_ctx_00);
    pTVar3 = gen_new_label_mips64el(tcg_ctx_00);
    pTVar1 = gen_new_label_mips64el(tcg_ctx_00);
    tcg_gen_ext32s_i64_mips64el(tcg_ctx_00,t1,t1);
    tcg_gen_ext32s_i64_mips64el(tcg_ctx_00,(TCGv_i64)l1,(TCGv_i64)l1);
    tcg_gen_brcondi_i64_mips64el(tcg_ctx_00,TCG_COND_NE,(TCGv_i64)l1,0,pTVar2);
    tcg_gen_movi_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[rd],0);
    tcg_gen_br(tcg_ctx_00,pTVar1);
    gen_set_label(tcg_ctx_00,pTVar2);
    tcg_gen_brcondi_i64_mips64el(tcg_ctx_00,TCG_COND_NE,t1,-0x80000000,pTVar3);
    tcg_gen_brcondi_i64_mips64el(tcg_ctx_00,TCG_COND_NE,(TCGv_i64)l1,-1,pTVar3);
    tcg_gen_mov_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[rd],t1);
    tcg_gen_br(tcg_ctx_00,pTVar1);
    gen_set_label(tcg_ctx_00,pTVar3);
    tcg_gen_div_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[rd],t1,(TCGv_i64)l1);
    tcg_gen_ext32s_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[rd],tcg_ctx_00->cpu_gpr[rd]);
    gen_set_label(tcg_ctx_00,pTVar1);
    goto LAB_00d3adda;
  }
  if (opc == 0x70000015) {
LAB_00d3aa2c:
    pTVar2 = gen_new_label_mips64el(tcg_ctx_00);
    pTVar3 = gen_new_label_mips64el(tcg_ctx_00);
    pTVar1 = gen_new_label_mips64el(tcg_ctx_00);
    tcg_gen_brcondi_i64_mips64el(tcg_ctx_00,TCG_COND_NE,(TCGv_i64)l1,0,pTVar2);
    tcg_gen_movi_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[rd],0);
    tcg_gen_br(tcg_ctx_00,pTVar1);
    gen_set_label(tcg_ctx_00,pTVar2);
    tcg_gen_brcondi_i64_mips64el(tcg_ctx_00,TCG_COND_NE,t1,-0x8000000000000000,pTVar3);
    tcg_gen_brcondi_i64_mips64el(tcg_ctx_00,TCG_COND_NE,(TCGv_i64)l1,-1,pTVar3);
    tcg_gen_mov_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[rd],t1);
    tcg_gen_br(tcg_ctx_00,pTVar1);
    gen_set_label(tcg_ctx_00,pTVar3);
    tcg_gen_div_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[rd],t1,(TCGv_i64)l1);
    gen_set_label(tcg_ctx_00,pTVar1);
    goto LAB_00d3adda;
  }
  if (opc == 0x70000016) {
LAB_00d3a6d1:
    pTVar2 = gen_new_label_mips64el(tcg_ctx_00);
    pTVar3 = gen_new_label_mips64el(tcg_ctx_00);
    tcg_gen_ext32u_i64_mips64el(tcg_ctx_00,t1,t1);
    tcg_gen_ext32u_i64_mips64el(tcg_ctx_00,(TCGv_i64)l1,(TCGv_i64)l1);
    tcg_gen_brcondi_i64_mips64el(tcg_ctx_00,TCG_COND_NE,(TCGv_i64)l1,0,pTVar2);
    tcg_gen_movi_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[rd],0);
    tcg_gen_br(tcg_ctx_00,pTVar3);
    gen_set_label(tcg_ctx_00,pTVar2);
    tcg_gen_divu_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[rd],t1,(TCGv_i64)l1);
    tcg_gen_ext32s_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[rd],tcg_ctx_00->cpu_gpr[rd]);
    gen_set_label(tcg_ctx_00,pTVar3);
  }
  else {
    if (opc == 0x70000017) {
LAB_00d3ab6c:
      pTVar2 = gen_new_label_mips64el(tcg_ctx_00);
      pTVar3 = gen_new_label_mips64el(tcg_ctx_00);
      tcg_gen_brcondi_i64_mips64el(tcg_ctx_00,TCG_COND_NE,(TCGv_i64)l1,0,pTVar2);
      tcg_gen_movi_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[rd],0);
      tcg_gen_br(tcg_ctx_00,pTVar3);
      gen_set_label(tcg_ctx_00,pTVar2);
      tcg_gen_divu_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[rd],t1,(TCGv_i64)l1);
      gen_set_label(tcg_ctx_00,pTVar3);
      goto LAB_00d3adda;
    }
    if (opc == 0x7000001c) {
LAB_00d3a7ba:
      pTVar2 = gen_new_label_mips64el(tcg_ctx_00);
      pTVar3 = gen_new_label_mips64el(tcg_ctx_00);
      pTVar1 = gen_new_label_mips64el(tcg_ctx_00);
      tcg_gen_ext32u_i64_mips64el(tcg_ctx_00,t1,t1);
      tcg_gen_ext32u_i64_mips64el(tcg_ctx_00,(TCGv_i64)l1,(TCGv_i64)l1);
      tcg_gen_brcondi_i64_mips64el(tcg_ctx_00,TCG_COND_EQ,(TCGv_i64)l1,0,pTVar2);
      tcg_gen_brcondi_i64_mips64el(tcg_ctx_00,TCG_COND_NE,t1,-0x80000000,pTVar3);
      tcg_gen_brcondi_i64_mips64el(tcg_ctx_00,TCG_COND_NE,(TCGv_i64)l1,-1,pTVar3);
      gen_set_label(tcg_ctx_00,pTVar2);
      tcg_gen_movi_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[rd],0);
      tcg_gen_br(tcg_ctx_00,pTVar1);
      gen_set_label(tcg_ctx_00,pTVar3);
      tcg_gen_rem_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[rd],t1,(TCGv_i64)l1);
      tcg_gen_ext32s_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[rd],tcg_ctx_00->cpu_gpr[rd]);
      gen_set_label(tcg_ctx_00,pTVar1);
      goto LAB_00d3adda;
    }
    if (opc == 0x7000001d) {
LAB_00d3ac1c:
      pTVar2 = gen_new_label_mips64el(tcg_ctx_00);
      pTVar3 = gen_new_label_mips64el(tcg_ctx_00);
      pTVar1 = gen_new_label_mips64el(tcg_ctx_00);
      tcg_gen_brcondi_i64_mips64el(tcg_ctx_00,TCG_COND_EQ,(TCGv_i64)l1,0,pTVar2);
      tcg_gen_brcondi_i64_mips64el(tcg_ctx_00,TCG_COND_NE,t1,-0x8000000000000000,pTVar3);
      tcg_gen_brcondi_i64_mips64el(tcg_ctx_00,TCG_COND_NE,(TCGv_i64)l1,-1,pTVar3);
      gen_set_label(tcg_ctx_00,pTVar2);
      tcg_gen_movi_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[rd],0);
      tcg_gen_br(tcg_ctx_00,pTVar1);
      gen_set_label(tcg_ctx_00,pTVar3);
      tcg_gen_rem_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[rd],t1,(TCGv_i64)l1);
      gen_set_label(tcg_ctx_00,pTVar1);
      goto LAB_00d3adda;
    }
    if (opc == 0x7000001e) {
LAB_00d3a8f7:
      pTVar2 = gen_new_label_mips64el(tcg_ctx_00);
      pTVar3 = gen_new_label_mips64el(tcg_ctx_00);
      tcg_gen_ext32u_i64_mips64el(tcg_ctx_00,t1,t1);
      tcg_gen_ext32u_i64_mips64el(tcg_ctx_00,(TCGv_i64)l1,(TCGv_i64)l1);
      tcg_gen_brcondi_i64_mips64el(tcg_ctx_00,TCG_COND_NE,(TCGv_i64)l1,0,pTVar2);
      tcg_gen_movi_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[rd],0);
      tcg_gen_br(tcg_ctx_00,pTVar3);
      gen_set_label(tcg_ctx_00,pTVar2);
      tcg_gen_remu_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[rd],t1,(TCGv_i64)l1);
      tcg_gen_ext32s_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[rd],tcg_ctx_00->cpu_gpr[rd]);
      gen_set_label(tcg_ctx_00,pTVar3);
      goto LAB_00d3adda;
    }
    if (opc != 0x7000001f) {
      if (opc == 0x7c000018) goto LAB_00d3a4aa;
      if (opc == 0x7c000019) goto LAB_00d3a4f9;
      if (opc == 0x7c00001a) goto LAB_00d3a56a;
      if (opc == 0x7c00001b) goto LAB_00d3a6d1;
      if (opc == 0x7c00001c) goto LAB_00d3a9e0;
      if (opc == 0x7c00001d) goto LAB_00d3aa06;
      if (opc == 0x7c00001e) goto LAB_00d3aa2c;
      if (opc == 0x7c00001f) goto LAB_00d3ab6c;
      if (opc == 0x7c000022) goto LAB_00d3a7ba;
      if (opc == 0x7c000023) goto LAB_00d3a8f7;
      if (opc == 0x7c000026) goto LAB_00d3ac1c;
      if (opc != 0x7c000027) goto LAB_00d3adda;
    }
    pTVar2 = gen_new_label_mips64el(tcg_ctx_00);
    pTVar3 = gen_new_label_mips64el(tcg_ctx_00);
    tcg_gen_brcondi_i64_mips64el(tcg_ctx_00,TCG_COND_NE,(TCGv_i64)l1,0,pTVar2);
    tcg_gen_movi_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[rd],0);
    tcg_gen_br(tcg_ctx_00,pTVar3);
    gen_set_label(tcg_ctx_00,pTVar2);
    tcg_gen_remu_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[rd],t1,(TCGv_i64)l1);
    gen_set_label(tcg_ctx_00,pTVar3);
  }
LAB_00d3adda:
  tcg_temp_free_i64(tcg_ctx_00,t1);
  tcg_temp_free_i64(tcg_ctx_00,(TCGv_i64)l1);
  return;
}

Assistant:

static void gen_loongson_integer(DisasContext *ctx, uint32_t opc,
                                 int rd, int rs, int rt)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t0, t1;

    if (rd == 0) {
        /* Treat as NOP. */
        return;
    }

    switch (opc) {
    case OPC_MULT_G_2E:
    case OPC_MULT_G_2F:
    case OPC_MULTU_G_2E:
    case OPC_MULTU_G_2F:
#if defined(TARGET_MIPS64)
    case OPC_DMULT_G_2E:
    case OPC_DMULT_G_2F:
    case OPC_DMULTU_G_2E:
    case OPC_DMULTU_G_2F:
#endif
        t0 = tcg_temp_new(tcg_ctx);
        t1 = tcg_temp_new(tcg_ctx);
        break;
    default:
        t0 = tcg_temp_local_new(tcg_ctx);
        t1 = tcg_temp_local_new(tcg_ctx);
        break;
    }

    gen_load_gpr(tcg_ctx, t0, rs);
    gen_load_gpr(tcg_ctx, t1, rt);

    switch (opc) {
    case OPC_MULT_G_2E:
    case OPC_MULT_G_2F:
        tcg_gen_mul_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0, t1);
        tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rd]);
        break;
    case OPC_MULTU_G_2E:
    case OPC_MULTU_G_2F:
        tcg_gen_ext32u_tl(tcg_ctx, t0, t0);
        tcg_gen_ext32u_tl(tcg_ctx, t1, t1);
        tcg_gen_mul_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0, t1);
        tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rd]);
        break;
    case OPC_DIV_G_2E:
    case OPC_DIV_G_2F:
        {
            TCGLabel *l1 = gen_new_label(tcg_ctx);
            TCGLabel *l2 = gen_new_label(tcg_ctx);
            TCGLabel *l3 = gen_new_label(tcg_ctx);
            tcg_gen_ext32s_tl(tcg_ctx, t0, t0);
            tcg_gen_ext32s_tl(tcg_ctx, t1, t1);
            tcg_gen_brcondi_tl(tcg_ctx, TCG_COND_NE, t1, 0, l1);
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], 0);
            tcg_gen_br(tcg_ctx, l3);
            gen_set_label(tcg_ctx, l1);
            tcg_gen_brcondi_tl(tcg_ctx, TCG_COND_NE, t0, INT_MIN, l2);
            tcg_gen_brcondi_tl(tcg_ctx, TCG_COND_NE, t1, -1, l2);
            tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0);
            tcg_gen_br(tcg_ctx, l3);
            gen_set_label(tcg_ctx, l2);
            tcg_gen_div_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0, t1);
            tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rd]);
            gen_set_label(tcg_ctx, l3);
        }
        break;
    case OPC_DIVU_G_2E:
    case OPC_DIVU_G_2F:
        {
            TCGLabel *l1 = gen_new_label(tcg_ctx);
            TCGLabel *l2 = gen_new_label(tcg_ctx);
            tcg_gen_ext32u_tl(tcg_ctx, t0, t0);
            tcg_gen_ext32u_tl(tcg_ctx, t1, t1);
            tcg_gen_brcondi_tl(tcg_ctx, TCG_COND_NE, t1, 0, l1);
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], 0);
            tcg_gen_br(tcg_ctx, l2);
            gen_set_label(tcg_ctx, l1);
            tcg_gen_divu_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0, t1);
            tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rd]);
            gen_set_label(tcg_ctx, l2);
        }
        break;
    case OPC_MOD_G_2E:
    case OPC_MOD_G_2F:
        {
            TCGLabel *l1 = gen_new_label(tcg_ctx);
            TCGLabel *l2 = gen_new_label(tcg_ctx);
            TCGLabel *l3 = gen_new_label(tcg_ctx);
            tcg_gen_ext32u_tl(tcg_ctx, t0, t0);
            tcg_gen_ext32u_tl(tcg_ctx, t1, t1);
            tcg_gen_brcondi_tl(tcg_ctx, TCG_COND_EQ, t1, 0, l1);
            tcg_gen_brcondi_tl(tcg_ctx, TCG_COND_NE, t0, INT_MIN, l2);
            tcg_gen_brcondi_tl(tcg_ctx, TCG_COND_NE, t1, -1, l2);
            gen_set_label(tcg_ctx, l1);
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], 0);
            tcg_gen_br(tcg_ctx, l3);
            gen_set_label(tcg_ctx, l2);
            tcg_gen_rem_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0, t1);
            tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rd]);
            gen_set_label(tcg_ctx, l3);
        }
        break;
    case OPC_MODU_G_2E:
    case OPC_MODU_G_2F:
        {
            TCGLabel *l1 = gen_new_label(tcg_ctx);
            TCGLabel *l2 = gen_new_label(tcg_ctx);
            tcg_gen_ext32u_tl(tcg_ctx, t0, t0);
            tcg_gen_ext32u_tl(tcg_ctx, t1, t1);
            tcg_gen_brcondi_tl(tcg_ctx, TCG_COND_NE, t1, 0, l1);
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], 0);
            tcg_gen_br(tcg_ctx, l2);
            gen_set_label(tcg_ctx, l1);
            tcg_gen_remu_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0, t1);
            tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rd]);
            gen_set_label(tcg_ctx, l2);
        }
        break;
#if defined(TARGET_MIPS64)
    case OPC_DMULT_G_2E:
    case OPC_DMULT_G_2F:
        tcg_gen_mul_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0, t1);
        break;
    case OPC_DMULTU_G_2E:
    case OPC_DMULTU_G_2F:
        tcg_gen_mul_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0, t1);
        break;
    case OPC_DDIV_G_2E:
    case OPC_DDIV_G_2F:
        {
            TCGLabel *l1 = gen_new_label(tcg_ctx);
            TCGLabel *l2 = gen_new_label(tcg_ctx);
            TCGLabel *l3 = gen_new_label(tcg_ctx);
            tcg_gen_brcondi_tl(tcg_ctx, TCG_COND_NE, t1, 0, l1);
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], 0);
            tcg_gen_br(tcg_ctx, l3);
            gen_set_label(tcg_ctx, l1);
            tcg_gen_brcondi_tl(tcg_ctx, TCG_COND_NE, t0, -1LL << 63, l2);
            tcg_gen_brcondi_tl(tcg_ctx, TCG_COND_NE, t1, -1LL, l2);
            tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0);
            tcg_gen_br(tcg_ctx, l3);
            gen_set_label(tcg_ctx, l2);
            tcg_gen_div_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0, t1);
            gen_set_label(tcg_ctx, l3);
        }
        break;
    case OPC_DDIVU_G_2E:
    case OPC_DDIVU_G_2F:
        {
            TCGLabel *l1 = gen_new_label(tcg_ctx);
            TCGLabel *l2 = gen_new_label(tcg_ctx);
            tcg_gen_brcondi_tl(tcg_ctx, TCG_COND_NE, t1, 0, l1);
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], 0);
            tcg_gen_br(tcg_ctx, l2);
            gen_set_label(tcg_ctx, l1);
            tcg_gen_divu_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0, t1);
            gen_set_label(tcg_ctx, l2);
        }
        break;
    case OPC_DMOD_G_2E:
    case OPC_DMOD_G_2F:
        {
            TCGLabel *l1 = gen_new_label(tcg_ctx);
            TCGLabel *l2 = gen_new_label(tcg_ctx);
            TCGLabel *l3 = gen_new_label(tcg_ctx);
            tcg_gen_brcondi_tl(tcg_ctx, TCG_COND_EQ, t1, 0, l1);
            tcg_gen_brcondi_tl(tcg_ctx, TCG_COND_NE, t0, -1LL << 63, l2);
            tcg_gen_brcondi_tl(tcg_ctx, TCG_COND_NE, t1, -1LL, l2);
            gen_set_label(tcg_ctx, l1);
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], 0);
            tcg_gen_br(tcg_ctx, l3);
            gen_set_label(tcg_ctx, l2);
            tcg_gen_rem_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0, t1);
            gen_set_label(tcg_ctx, l3);
        }
        break;
    case OPC_DMODU_G_2E:
    case OPC_DMODU_G_2F:
        {
            TCGLabel *l1 = gen_new_label(tcg_ctx);
            TCGLabel *l2 = gen_new_label(tcg_ctx);
            tcg_gen_brcondi_tl(tcg_ctx, TCG_COND_NE, t1, 0, l1);
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], 0);
            tcg_gen_br(tcg_ctx, l2);
            gen_set_label(tcg_ctx, l1);
            tcg_gen_remu_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0, t1);
            gen_set_label(tcg_ctx, l2);
        }
        break;
#endif
    }

    tcg_temp_free(tcg_ctx, t0);
    tcg_temp_free(tcg_ctx, t1);
}